

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cargo.c
# Opt level: O2

char ** cargo_get_option_mutex_groups(cargo_t ctx,char *opt,size_t *count)

{
  cargo_opt_t *pcVar1;
  int iVar2;
  size_t in_RAX;
  char **ppcVar3;
  char *pcVar4;
  ulong uVar5;
  ulong uVar6;
  size_t opt_i;
  
  if (ctx == (cargo_t)0x0) {
    __assert_fail("ctx",
                  "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c"
                  ,0x1b94,
                  "const char **cargo_get_option_mutex_groups(cargo_t, const char *, size_t *)");
  }
  if (opt != (char *)0x0) {
    if (count != (size_t *)0x0) {
      *count = 0;
    }
    ppcVar3 = (char **)0x0;
    opt_i = in_RAX;
    iVar2 = _cargo_find_option_name(ctx,opt,&opt_i,(size_t *)0x0);
    if (iVar2 == 0) {
      pcVar1 = ctx->options;
      ppcVar3 = pcVar1[opt_i].mutex_group_names;
      if (ppcVar3 == (char **)0x0) {
        ppcVar3 = (char **)_cargo_calloc(pcVar1[opt_i].mutex_group_count,8);
        pcVar1[opt_i].mutex_group_names = ppcVar3;
        if (ppcVar3 != (char **)0x0) {
          for (uVar6 = 0; uVar5 = pcVar1[opt_i].mutex_group_count, uVar6 < uVar5; uVar6 = uVar6 + 1)
          {
            pcVar4 = _cargo_strdup(ctx->mutex_groups[pcVar1[opt_i].mutex_group_idxs[uVar6]].name);
            pcVar1[opt_i].mutex_group_names[uVar6] = pcVar4;
          }
          if (count != (size_t *)0x0) {
            *count = uVar5;
            uVar5 = pcVar1[opt_i].mutex_group_count;
          }
          if (uVar5 != 0) {
            return pcVar1[opt_i].mutex_group_names;
          }
        }
        ppcVar3 = (char **)0x0;
      }
      else if (count != (size_t *)0x0) {
        *count = pcVar1[opt_i].mutex_group_count;
      }
    }
    return ppcVar3;
  }
  __assert_fail("opt",
                "/workspace/llm4binary/github/license_c_cmakelists/JoakimSoderberg[P]cargo/cargo.c",
                0x1b95,"const char **cargo_get_option_mutex_groups(cargo_t, const char *, size_t *)"
               );
}

Assistant:

const char **cargo_get_option_mutex_groups(cargo_t ctx,
                                            const char *opt, size_t *count)
{
    size_t i;
    cargo_opt_t *o = NULL;
    cargo_group_t *mgrp = NULL;
    size_t opt_i;
    assert(ctx);
    assert(opt);

    if (count) *count = 0;

    if (_cargo_find_option_name(ctx, opt, &opt_i, NULL))
    {
        CARGODBG(1, "No such option \"%s\"\n", opt);
        return NULL;
    }

    o = &ctx->options[opt_i];

    // Use cached version. Mutex group count should
    // not be changed between calls anyway.
    if (o->mutex_group_names)
    {
        if (count) *count = o->mutex_group_count;
        return (const char **)o->mutex_group_names;
    }

    if (!(o->mutex_group_names = _cargo_calloc(o->mutex_group_count, sizeof(char *))))
    {
        CARGODBG(1, "Out of memory\n");
        return NULL;
    }

    for (i = 0; i < o->mutex_group_count; i++)
    {
        mgrp = &ctx->mutex_groups[o->mutex_group_idxs[i]];
        o->mutex_group_names[i] = _cargo_strdup(mgrp->name);
    }

    if (count) *count = o->mutex_group_count;

    if (o->mutex_group_count == 0)
    {
        return NULL;
    }

    return (const char **)o->mutex_group_names;
}